

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int getToken(uchar **pz)

{
  int iVar1;
  uchar *z;
  long in_FS_OFFSET;
  int t;
  int local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  z = *pz;
  local_24 = -0x55555556;
  do {
    iVar1 = sqlite3GetToken(z,&local_24);
    z = z + iVar1;
  } while ((long)local_24 == 0xb8);
  if ((((local_24 - 0x76U < 0x31) &&
       ((0x1800000000003U >> ((ulong)(local_24 - 0x76U) & 0x3f) & 1) != 0)) || (local_24 == 0x3c))
     || (yyFallback[local_24] == 0x3c)) {
    local_24 = 0x3c;
  }
  *pz = z;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return local_24;
}

Assistant:

static int getToken(const unsigned char **pz){
  const unsigned char *z = *pz;
  int t;                          /* Token type to return */
  do {
    z += sqlite3GetToken(z, &t);
  }while( t==TK_SPACE );
  if( t==TK_ID
   || t==TK_STRING
   || t==TK_JOIN_KW
   || t==TK_WINDOW
   || t==TK_OVER
   || sqlite3ParserFallback(t)==TK_ID
  ){
    t = TK_ID;
  }
  *pz = z;
  return t;
}